

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O1

void addterm(_func_void *func,char *name)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)NumTerms;
  bVar5 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    if (TermFuncs[0] != func) {
      uVar4 = 0;
      do {
        if (uVar2 - 1 == uVar4) goto LAB_002ca308;
        uVar1 = uVar4 + 1;
        lVar3 = uVar4 + 1;
        uVar4 = uVar1;
      } while (TermFuncs[lVar3] != func);
      bVar5 = uVar1 < uVar2;
    }
    if (bVar5) {
      return;
    }
  }
LAB_002ca308:
  if (NumTerms == 0x40) {
    (*func)();
    I_FatalError("Too many exit functions registered.\nIncrease MAX_TERMS in i_main.cpp");
  }
  lVar3 = (long)NumTerms;
  TermNames[lVar3] = name;
  NumTerms = NumTerms + 1;
  TermFuncs[lVar3] = func;
  return;
}

Assistant:

void addterm (void (*func) (), const char *name)
{
	// Make sure this function wasn't already registered.
	for (int i = 0; i < NumTerms; ++i)
	{
		if (TermFuncs[i] == func)
		{
			return;
		}
	}
    if (NumTerms == MAX_TERMS)
	{
		func ();
		I_FatalError (
			"Too many exit functions registered.\n"
			"Increase MAX_TERMS in i_main.cpp");
	}
	TermNames[NumTerms] = name;
    TermFuncs[NumTerms++] = func;
}